

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O0

int __thiscall bdHashSet::modify(bdHashSet *this,string *key,bdHashEntry *entry,uint32_t modFlags)

{
  long lVar1;
  time_t tVar2;
  byte bVar3;
  bool bVar4;
  __type _Var5;
  bool bVar6;
  time_t store;
  pointer ppVar7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>
  local_1a0;
  string local_120;
  string local_100;
  undefined1 local_e0 [8];
  bdHashEntry newEntry;
  time_t newKillTime;
  time_t existKillTime;
  bool update;
  bool sameSecret;
  bool noSecret;
  bool updated;
  time_t now;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
  local_48;
  iterator it;
  iterator eit;
  iterator sit;
  uint32_t modFlags_local;
  bdHashEntry *entry_local;
  string *key_local;
  bdHashSet *this_local;
  
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
  ::_Rb_tree_iterator(&eit);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
  ::_Rb_tree_iterator(&it);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
  ::_Rb_tree_iterator(&local_48);
  eit = std::
        multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
        ::lower_bound(&this->mEntries,key);
  it = std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
       ::upper_bound(&this->mEntries,key);
  store = time((time_t *)0x0);
  bVar3 = 0;
  local_48._M_node = eit._M_node;
  do {
    bVar4 = std::operator!=(&local_48,&it);
    if (!bVar4) {
      if ((bVar3 == 0) && (modFlags == 1)) {
        std::__cxx11::string::string((string *)&local_100,(string *)entry);
        std::__cxx11::string::string((string *)&local_120,(string *)&entry->mSecret);
        bdHashEntry::bdHashEntry
                  ((bdHashEntry *)local_e0,&local_100,&local_120,entry->mLifetime,store);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_100);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bdHashEntry_&,_true>
                  (&local_1a0,key,(bdHashEntry *)local_e0);
        std::
        multimap<std::__cxx11::string,bdHashEntry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bdHashEntry>>>
        ::insert<std::pair<std::__cxx11::string,bdHashEntry>>
                  ((multimap<std::__cxx11::string,bdHashEntry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bdHashEntry>>>
                    *)&this->mEntries,&local_1a0);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>
        ::~pair(&local_1a0);
        bVar3 = 1;
        bdHashEntry::~bdHashEntry((bdHashEntry *)local_e0);
      }
      return (uint)bVar3;
    }
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
             ::operator->(&local_48);
    _Var5 = std::operator==(&(ppVar7->second).mValue,&entry->mValue);
    if (_Var5) {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
               ::operator->(&local_48);
      bVar6 = std::operator==(&(ppVar7->second).mSecret,"");
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
               ::operator->(&local_48);
      _Var5 = std::operator==(&(ppVar7->second).mSecret,&entry->mSecret);
      bVar4 = false;
      if ((bVar6) && (_Var5)) {
        if (modFlags == 1) {
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
                   ::operator->(&local_48);
          lVar1 = (ppVar7->second).mLifetime;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
                   ::operator->(&local_48);
          bVar4 = lVar1 + (ppVar7->second).mStoreTS < entry->mLifetime + store;
        }
      }
      else if (_Var5) {
        if (modFlags == 1) {
          bVar4 = true;
        }
        else if (modFlags == 2) {
          std::
          multimap<std::__cxx11::string,bdHashEntry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bdHashEntry>>>
          ::erase_abi_cxx11_((multimap<std::__cxx11::string,bdHashEntry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bdHashEntry>>>
                              *)&this->mEntries,(iterator)local_48._M_node);
          return 1;
        }
      }
      if (bVar4) {
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
                 ::operator->(&local_48);
        (ppVar7->second).mStoreTS = store;
        tVar2 = entry->mLifetime;
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
                 ::operator->(&local_48);
        (ppVar7->second).mLifetime = tVar2;
        bVar3 = 1;
      }
    }
    newEntry.mLifetime =
         (time_t)std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>
                 ::operator++(&local_48,0);
  } while( true );
}

Assistant:

int 	bdHashSet::modify(std::string key, bdHashEntry *entry, uint32_t modFlags) {
	std::multimap<std::string, bdHashEntry>::iterator sit, eit, it;
        sit = mEntries.lower_bound(key);
        eit = mEntries.upper_bound(key);

	time_t now = time(NULL);

	bool updated = false;
	for (it = sit; it != eit; it++) {
		/* check it all */
		if (it->second.mValue == entry->mValue) {
			bool noSecret = (it->second.mSecret == "");
			bool sameSecret = (it->second.mSecret == entry->mSecret);
			bool update = false;

			if (noSecret && sameSecret) {
				/* only allowed to increase lifetime */
				if (modFlags == BITDHT_HASH_ENTRY_ADD) {
					time_t existKillTime = it->second.mLifetime + it->second.mStoreTS;
					time_t newKillTime = entry->mLifetime + now;
					if (newKillTime > existKillTime) {
						update = true;
					}
				}
			}
			else if (sameSecret) {
				if (modFlags == BITDHT_HASH_ENTRY_ADD) {
					update = true;
				}
				else if (modFlags == BITDHT_HASH_ENTRY_DELETE) {
					/* do it here */
					mEntries.erase(it);
					return 1;
				}
			}
			
			if (update) {
				it->second.mStoreTS = now;
				it->second.mLifetime = entry->mLifetime;
				updated = true;
			}
		}
	}

	if ((!updated) && (modFlags == BITDHT_HASH_ENTRY_ADD)) {
		/* create a new entry */
		bdHashEntry newEntry(entry->mValue, entry->mSecret, entry->mLifetime, now);
	        mEntries.insert(std::pair<std::string, bdHashEntry>(key, newEntry));
		updated = true;
	}
	return updated;
}